

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

void __thiscall
t_dart_generator::generate_dart_struct_writer(t_dart_generator *this,ostream *out,t_struct *tstruct)

{
  t_field *tfield;
  t_struct *ptVar1;
  bool bVar2;
  e_req eVar3;
  ostream *poVar4;
  reference pptVar5;
  string *psVar6;
  t_type *ttype;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  string local_190;
  string local_170;
  allocator local_149;
  string local_148;
  byte local_122;
  allocator local_121;
  undefined1 local_120 [6];
  bool null_allowed;
  string local_100;
  byte local_d9;
  undefined1 local_d8 [7];
  bool could_be_unset;
  undefined1 local_b8 [8];
  string field_name;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_88;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string local_70;
  string local_40;
  t_struct *local_20;
  t_struct *tstruct_local;
  ostream *out_local;
  t_dart_generator *this_local;
  
  local_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_40);
  std::operator<<(poVar4,"write(TProtocol oprot)");
  std::__cxx11::string::~string((string *)&local_40);
  ptVar1 = tstruct_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70," ",(allocator *)((long)&fields + 7));
  scope_up(this,(ostream *)ptVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&fields + 7));
  f_iter._M_current = (t_field **)t_struct::get_sorted_members(local_20);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_88);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"validate();");
  std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"oprot.writeStructBegin(_STRUCT_DESC);");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  local_88._M_current =
       (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  while( true ) {
    field_name.field_2._8_8_ =
         std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                   ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
    bVar2 = __gnu_cxx::operator!=
                      (&local_88,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&field_name.field_2 + 8));
    if (!bVar2) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_88);
    psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
    std::__cxx11::string::string((string *)local_d8,(string *)psVar6);
    get_member_name((string *)local_b8,this,(string *)local_d8);
    std::__cxx11::string::~string((string *)local_d8);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_88);
    eVar3 = t_field::get_req(*pptVar5);
    local_d9 = eVar3 == T_OPTIONAL;
    if ((bool)local_d9) {
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
      poVar4 = std::operator<<(poVar4,"if (");
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_88);
      generate_isset_check_abi_cxx11_(&local_100,this,*pptVar5);
      poVar4 = std::operator<<(poVar4,(string *)&local_100);
      std::operator<<(poVar4,")");
      std::__cxx11::string::~string((string *)&local_100);
      ptVar1 = tstruct_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_120," ",&local_121);
      scope_up(this,(ostream *)ptVar1,(string *)local_120);
      std::__cxx11::string::~string((string *)local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
    }
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_88);
    ttype = t_field::get_type(*pptVar5);
    local_122 = type_can_be_null(this,ttype);
    if ((bool)local_122) {
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
      poVar4 = std::operator<<(poVar4,"if (this.");
      poVar4 = std::operator<<(poVar4,(string *)local_b8);
      std::operator<<(poVar4," != null)");
      ptVar1 = tstruct_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_148," ",&local_149);
      scope_up(this,(ostream *)ptVar1,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
    }
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar4 = std::operator<<(poVar4,"oprot.writeFieldBegin(_");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_88);
    psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
    std::__cxx11::string::string((string *)&local_190,(string *)psVar6);
    constant_name(&local_170,this,&local_190);
    poVar4 = std::operator<<(poVar4,(string *)&local_170);
    poVar4 = std::operator<<(poVar4,"_FIELD_DESC);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    ptVar1 = tstruct_local;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_88);
    tfield = *pptVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b0,"this.",&local_1b1);
    generate_serialize_field(this,(ostream *)ptVar1,tfield,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar4 = std::operator<<(poVar4,"oprot.writeFieldEnd();");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    ptVar1 = tstruct_local;
    if ((local_122 & 1) != 0) {
      std::__cxx11::string::string((string *)&local_1d8,(string *)&::endl_abi_cxx11_);
      scope_down(this,(ostream *)ptVar1,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    ptVar1 = tstruct_local;
    if ((local_d9 & 1) != 0) {
      std::__cxx11::string::string((string *)&local_1f8,(string *)&::endl_abi_cxx11_);
      scope_down(this,(ostream *)ptVar1,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    std::__cxx11::string::~string((string *)local_b8);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_88);
  }
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"oprot.writeFieldStop();");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_218,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_218);
  poVar4 = std::operator<<(poVar4,"oprot.writeStructEnd();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_218);
  ptVar1 = tstruct_local;
  std::__cxx11::string::string((string *)&local_238,(string *)&endl2_abi_cxx11_);
  scope_down(this,(ostream *)ptVar1,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  return;
}

Assistant:

void t_dart_generator::generate_dart_struct_writer(ostream& out, t_struct* tstruct) {
  out << indent() << "write(TProtocol oprot)";
  scope_up(out);

  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;

  // performs various checks (e.g. check that all required fields are set)
  indent(out) << "validate();" << endl2;

  indent(out) << "oprot.writeStructBegin(_STRUCT_DESC);" << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    string field_name = get_member_name((*f_iter)->get_name());
    bool could_be_unset = (*f_iter)->get_req() == t_field::T_OPTIONAL;
    if (could_be_unset) {
      indent(out) << "if (" << generate_isset_check(*f_iter) << ")";
      scope_up(out);
    }
    bool null_allowed = type_can_be_null((*f_iter)->get_type());
    if (null_allowed) {
      indent(out) << "if (this." << field_name << " != null)";
      scope_up(out);
    }

    indent(out) << "oprot.writeFieldBegin(_" << constant_name((*f_iter)->get_name())
                << "_FIELD_DESC);" << endl;

    // Write field contents
    generate_serialize_field(out, *f_iter, "this.");

    // Write field closer
    indent(out) << "oprot.writeFieldEnd();" << endl;

    if (null_allowed) {
      scope_down(out);
    }
    if (could_be_unset) {
      scope_down(out);
    }
  }
  // Write the struct map
  indent(out) << "oprot.writeFieldStop();" << endl << indent() << "oprot.writeStructEnd();"
      << endl;

  scope_down(out, endl2);
}